

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_solve_face(REF_FACELIFT ref_facelift)

{
  int iVar1;
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  uint uVar2;
  REF_INT local_f4;
  REF_INT local_f0;
  int local_ec;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL hits;
  REF_DBL disp [3];
  int local_b4;
  REF_INT center;
  REF_INT other_geom;
  REF_INT cell_node;
  REF_INT item;
  REF_INT nodes [27];
  REF_INT local_30;
  int local_2c;
  REF_INT cell;
  REF_INT center_geom;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift_local;
  
  ref_geom_00 = ref_facelift->grid->geom;
  ref_cell_00 = ref_facelift->tri_cell;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x105,"ref_facelift_solve_face","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    for (local_2c = 0; local_2c < ref_geom_00->max; local_2c = local_2c + 1) {
      if ((ref_geom_00->descr[local_2c * 6] == 2) && (ref_facelift->strong_bc[local_2c] == 0)) {
        iVar1 = ref_geom_00->descr[local_2c * 6 + 5];
        _ref_private_macro_code_rss_1 = 0.0;
        hits = 0.0;
        disp[0] = 0.0;
        disp[1] = 0.0;
        if ((iVar1 < 0) || (ref_cell_00->ref_adj->nnode <= iVar1)) {
          local_ec = -1;
        }
        else {
          local_ec = ref_cell_00->ref_adj->first[iVar1];
        }
        other_geom = local_ec;
        if (local_ec == -1) {
          local_f0 = -1;
        }
        else {
          local_f0 = ref_cell_00->ref_adj->item[local_ec].ref;
        }
        local_30 = local_f0;
        while (other_geom != -1) {
          uVar2 = ref_cell_nodes(ref_cell_00,local_30,&cell_node);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x110,"ref_facelift_solve_face",(ulong)uVar2,"nodes");
            return uVar2;
          }
          for (center = 0; center < ref_cell_00->node_per; center = center + 1) {
            if ((&cell_node)[center] != iVar1) {
              uVar2 = ref_geom_find(ref_geom_00,(&cell_node)[center],2,
                                    ref_geom_00->descr[local_2c * 6 + 1],&local_b4);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x115,"ref_facelift_solve_face",(ulong)uVar2,"other geom");
                return uVar2;
              }
              _ref_private_macro_code_rss_1 = _ref_private_macro_code_rss_1 + 0.5;
              hits = ref_facelift->displacement[local_b4 * 3] * 0.5 + hits;
              disp[0] = ref_facelift->displacement[local_b4 * 3 + 1] * 0.5 + disp[0];
              disp[1] = ref_facelift->displacement[local_b4 * 3 + 2] * 0.5 + disp[1];
            }
          }
          if (0.1 < _ref_private_macro_code_rss_1) {
            ref_facelift->displacement[local_2c * 3] = hits / _ref_private_macro_code_rss_1;
            ref_facelift->displacement[local_2c * 3 + 1] = disp[0] / _ref_private_macro_code_rss_1;
            ref_facelift->displacement[local_2c * 3 + 2] = disp[1] / _ref_private_macro_code_rss_1;
          }
          other_geom = ref_cell_00->ref_adj->item[other_geom].next;
          if (other_geom == -1) {
            local_f4 = -1;
          }
          else {
            local_f4 = ref_cell_00->ref_adj->item[other_geom].ref;
          }
          local_30 = local_f4;
        }
      }
    }
    ref_facelift_local._4_4_ = 0;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_solve_face(REF_FACELIFT ref_facelift) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_CELL ref_cell = ref_facelift_tri(ref_facelift);
  REF_INT center_geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node, other_geom, center;
  REF_DBL disp[3], hits;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  /* psudo laplace */
  each_ref_geom_face(ref_geom, center_geom) {
    if (!ref_facelift_strong_bc(ref_facelift, center_geom)) {
      center = ref_geom_node(ref_geom, center_geom);
      hits = 0.0;
      disp[0] = 0.0;
      disp[1] = 0.0;
      disp[2] = 0.0;
      each_ref_cell_having_node(ref_cell, center, item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          if (nodes[cell_node] != center) {
            RSS(ref_geom_find(ref_geom, nodes[cell_node], REF_GEOM_FACE,
                              ref_geom_id(ref_geom, center_geom), &other_geom),
                "other geom");
            hits += 0.5;
            disp[0] +=
                0.5 * ref_facelift_displacement(ref_facelift, 0, other_geom);
            disp[1] +=
                0.5 * ref_facelift_displacement(ref_facelift, 1, other_geom);
            disp[2] +=
                0.5 * ref_facelift_displacement(ref_facelift, 2, other_geom);
          }
        }
        if (hits > 0.1) {
          ref_facelift_displacement(ref_facelift, 0, center_geom) =
              disp[0] / hits;
          ref_facelift_displacement(ref_facelift, 1, center_geom) =
              disp[1] / hits;
          ref_facelift_displacement(ref_facelift, 2, center_geom) =
              disp[2] / hits;
        }
      }
    }
  }

  return REF_SUCCESS;
}